

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::ReadFont(uint8_t *data,size_t len,Font *font)

{
  bool bVar1;
  undefined1 local_40 [8];
  Buffer file;
  Font *font_local;
  size_t len_local;
  uint8_t *data_local;
  
  file.offset_ = (size_t)font;
  Buffer::Buffer((Buffer *)local_40,data,len);
  bVar1 = Buffer::ReadU32((Buffer *)local_40,(uint32_t *)file.offset_);
  if (bVar1) {
    if (*(int *)file.offset_ == 0x74746366) {
      data_local._7_1_ = false;
    }
    else {
      data_local._7_1_ = ReadTrueTypeFont((Buffer *)local_40,data,len,(Font *)file.offset_);
    }
  }
  else {
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

bool ReadFont(const uint8_t* data, size_t len, Font* font) {
  Buffer file(data, len);

  if (!file.ReadU32(&font->flavor)) {
    return FONT_COMPRESSION_FAILURE();
  }

  if (font->flavor == kTtcFontFlavor) {
    return FONT_COMPRESSION_FAILURE();
  }
  return ReadTrueTypeFont(&file, data, len, font);
}